

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file_handle.cpp
# Opt level: O1

void __thiscall
SplitFixture_Small_Test<const_unsigned_char>::TestBody
          (SplitFixture_Small_Test<const_unsigned_char> *this)

{
  _func_int **pp_Var1;
  TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)> *pTVar2;
  ActionInterface<unsigned_long_(const_void_*,_unsigned_long)> *impl;
  mock_callback *this_00;
  _func_int *message;
  size_t size;
  size_t total;
  AssertionResult gtest_ar;
  TypeParam buffer [10];
  MatcherBase<const_void_*> local_c0;
  MatcherBase<unsigned_long> local_a8;
  unsigned_long *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  unsigned_long local_80;
  _Any_data local_78;
  code *local_68;
  undefined1 local_58 [8];
  MatcherBase<unsigned_long> local_50;
  MatcherBase<const_void_*> local_38;
  uchar local_20 [16];
  
  local_80 = 10;
  local_20[8] = '\0';
  local_20[9] = '\0';
  local_20[0] = '\0';
  local_20[1] = '\0';
  local_20[2] = '\0';
  local_20[3] = '\0';
  local_20[4] = '\0';
  local_20[5] = '\0';
  local_20[6] = '\0';
  local_20[7] = '\0';
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_c0,local_20);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_a8,10);
  this_00 = &(this->super_SplitFixture<const_unsigned_char>).callback;
  anon_unknown.dwarf_c158e::SplitFixture<const_unsigned_char>::mock_callback::gmock_call
            ((MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *)local_58,this_00,
             (Matcher<const_void_*> *)&local_c0,(Matcher<unsigned_long> *)&local_a8);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::
           InternalExpectedAt((MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *)local_58,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
                              ,0x40,"this->callback","call (buffer, size)");
  pTVar2 = testing::internal::TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)>::Times
                     (pTVar2,1);
  local_90 = (unsigned_long *)operator_new(8);
  *local_90 = 10;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_long*>
            (&local_88,local_90);
  impl = (ActionInterface<unsigned_long_(const_void_*,_unsigned_long)> *)operator_new(0x18);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001e7320;
  pp_Var1 = (_func_int **)*local_90;
  impl[1]._vptr_ActionInterface = pp_Var1;
  impl[2]._vptr_ActionInterface = pp_Var1;
  testing::Action<unsigned_long_(const_void_*,_unsigned_long)>::Action
            ((Action<unsigned_long_(const_void_*,_unsigned_long)> *)&local_78,impl);
  testing::internal::TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)>::WillOnce
            (pTVar2,(Action<unsigned_long_(const_void_*,_unsigned_long)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<const_void_*>::~MatcherBase
            ((MatcherBase<const_void_*> *)(local_58 + 0x20));
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)(local_58 + 8));
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_a8);
  testing::internal::MatcherBase<const_void_*>::~MatcherBase(&local_c0);
  local_78._M_unused._M_member_pointer =
       pstore::file::details::
       split<unsigned_short,unsigned_char_const,(anonymous_namespace)::SplitFixture<unsigned_char_const>::mock_callback>
                 (local_20,10,this_00);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_58,"size","total",&local_80,(unsigned_long *)local_78._M_pod_data);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x1ae738;
    }
    else {
      message = *local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
               ,0x44,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_c0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_c0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))()
      ;
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_58 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TYPED_TEST (SplitFixture, Small) {
    constexpr std::size_t size{10};
    TypeParam buffer[size] = {};

    using ::testing::Return;
    EXPECT_CALL (this->callback, call (buffer, size)).Times (1).WillOnce (Return (size));

    using pstore::file::details::split;
    std::size_t const total = split<std::uint16_t> (buffer, sizeof (buffer), this->callback);
    EXPECT_EQ (size, total);
}